

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

ptr __thiscall
gch::detail::small_vector_base<std::allocator<int>,64u>::append_element<int_const&>
          (small_vector_base<std::allocator<int>,64u> *this,int *args)

{
  ulong uVar1;
  long lVar2;
  ptr piVar3;
  int *__dest;
  ulong uVar4;
  ulong __n;
  
  if (*(ulong *)(this + 0x10) < *(ulong *)(this + 8)) {
    piVar3 = emplace_into_current_end<int_const&>
                       ((small_vector_base<std::allocator<int>,_64U> *)this,args);
    return piVar3;
  }
  if (*(long *)(this + 0x10) != 0x1fffffffffffffff) {
    uVar4 = *(long *)(this + 0x10) + 1;
    uVar1 = *(ulong *)(this + 8);
    __n = uVar1 * 2;
    if (uVar1 * 2 <= uVar4) {
      __n = uVar4;
    }
    if (0x1fffffffffffffff - uVar1 <= uVar1) {
      __n = 0x1fffffffffffffff;
    }
    __dest = __gnu_cxx::new_allocator<int>::allocate
                       ((new_allocator<int> *)this,__n,(void *)(uVar1 * 4 + *(long *)this));
    lVar2 = *(long *)(this + 0x10);
    __dest[lVar2] = *args;
    if (*(long *)(this + 0x10) != 0) {
      memcpy(__dest,*(void **)this,*(long *)(this + 0x10) << 2);
    }
    small_vector_base<std::allocator<int>,_64U>::wipe
              ((small_vector_base<std::allocator<int>,_64U> *)this);
    *(int **)this = __dest;
    *(ulong *)(this + 8) = __n;
    *(ulong *)(this + 0x10) = uVar4;
    return __dest + lVar2;
  }
  small_vector_base<std::allocator<int>,_64U>::throw_allocation_size_error();
}

Assistant:

constexpr size_ty size     (void) const noexcept { return m_size; }